

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int PVIP_parse_from(GREG *G,yyrule yystart)

{
  int end;
  int iVar1;
  int iVar2;
  char *pcVar3;
  yythunk *pyVar4;
  PVIPNode **ppPVar5;
  long lVar6;
  PVIPParserContext *pPVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  undefined8 auStack_78 [9];
  
  bVar11 = 0;
  if (G->buflen == 0) {
    G->buflen = 0x400;
    pcVar3 = (char *)malloc(0x400);
    G->buf = pcVar3;
    G->textlen = 0x400;
    pcVar3 = (char *)malloc(0x400);
    G->text = pcVar3;
    G->thunkslen = 0x80;
    pyVar4 = (yythunk *)malloc(0x1000);
    G->thunks = pyVar4;
    G->valslen = 0x80;
    ppPVar5 = (PVIPNode **)malloc(0x400);
    G->vals = ppPVar5;
    G->thunkpos = 0;
    G->pos = 0;
    G->limit = 0;
    G->begin = 0;
    G->end = 0;
  }
  G->pos = 0;
  G->begin = 0;
  G->end = 0;
  G->thunkpos = 0;
  G->val = G->vals;
  iVar1 = (*yystart)(G);
  if (iVar1 != 0) {
    if (0 < G->thunkpos) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        pyVar4 = G->thunks;
        iVar2 = *(int *)((long)&pyVar4->begin + lVar10);
        end = *(int *)((long)&pyVar4->end + lVar10);
        if (end != 0) {
          iVar2 = yyText(G,iVar2,end);
        }
        pcVar3 = G->text;
        pPVar7 = &G->data;
        puVar8 = auStack_78;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar8 = *(undefined8 *)pPVar7;
          pPVar7 = (PVIPParserContext *)((long)pPVar7 + (ulong)bVar11 * -0x10 + 8);
          puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
        }
        (**(code **)((long)&pyVar4->action + lVar10))(G,pcVar3,iVar2,(long)&pyVar4->begin + lVar10);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar9 < G->thunkpos);
    }
    G->thunkpos = 0;
  }
  iVar2 = G->limit - G->pos;
  G->limit = iVar2;
  if (iVar2 != 0) {
    memmove(G->buf,G->buf + G->pos,(long)iVar2);
  }
  iVar2 = G->pos;
  G->offset = G->offset + iVar2;
  G->begin = G->begin - iVar2;
  G->end = G->end - iVar2;
  G->thunkpos = 0;
  G->pos = 0;
  return iVar1;
}

Assistant:

YY_PARSE(int) YY_NAME(parse_from)(GREG *G, yyrule yystart)
{
  int yyok;
  if (!G->buflen)
    {
      G->buflen= YY_BUFFER_START_SIZE;
      G->buf= (char*)YY_ALLOC(G->buflen, G->data);
      G->textlen= YY_BUFFER_START_SIZE;
      G->text= (char*)YY_ALLOC(G->textlen, G->data);
      G->thunkslen= YY_STACK_SIZE;
      G->thunks= (yythunk*)YY_ALLOC(sizeof(yythunk) * G->thunkslen, G->data);
      G->valslen= YY_STACK_SIZE;
      G->vals= (YYSTYPE*)YY_ALLOC(sizeof(YYSTYPE) * G->valslen, G->data);
      G->begin= G->end= G->pos= G->limit= G->thunkpos= 0;
    }
  G->pos = 0;
  G->begin= G->end= G->pos;
  G->thunkpos= 0;
  G->val= G->vals;
  yyok= yystart(G);
  if (yyok) yyDone(G);
  yyCommit(G);
  return yyok;
  (void)yyrefill;
  (void)yymatchDot;
  (void)yymatchChar;
  (void)yymatchString;
  (void)yymatchClass;
  (void)yyDo;
  (void)yyText;
  (void)yyDone;
  (void)yyCommit;
  (void)yyAccept;
  (void)yyPush;
  (void)yyPop;
  (void)yySet;
}